

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_common.c
# Opt level: O0

void on_device_send_twin_update_complete_callback
               (DEVICE_TWIN_UPDATE_RESULT result,int status_code,void *context)

{
  LOGGER_LOG p_Var1;
  AMQP_TRANSPORT_DEVICE_TWIN_CONTEXT *dev_twin_ctx;
  LOGGER_LOG l;
  void *context_local;
  int status_code_local;
  DEVICE_TWIN_UPDATE_RESULT result_local;
  
  if (context == (void *)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                ,"on_device_send_twin_update_complete_callback",0x20b,1,
                "Invalid argument (context is NULL)");
    }
  }
  else {
    (**(code **)((long)context + 0x30))(*context,status_code,*(undefined8 *)((long)context + 0x50));
    if ((199 < status_code) && (status_code < 300)) {
      *(undefined8 *)(*(long *)((long)context + 0x58) + 0x28) = 0;
    }
    free(context);
  }
  return;
}

Assistant:

static void on_device_send_twin_update_complete_callback(DEVICE_TWIN_UPDATE_RESULT result, int status_code, void* context)
{
    (void)result;

    if (context == NULL)
    {
        LogError("Invalid argument (context is NULL)");
    }
    else
    {
        AMQP_TRANSPORT_DEVICE_TWIN_CONTEXT* dev_twin_ctx = (AMQP_TRANSPORT_DEVICE_TWIN_CONTEXT*)context;
        dev_twin_ctx->transport_callbacks.twin_rpt_state_complete_cb(dev_twin_ctx->item_id, status_code, dev_twin_ctx->transport_ctx);

        if (status_code >= 200 && status_code < 300)
        {
            dev_twin_ctx->device->number_of_previous_failures = 0;
        }

        free(dev_twin_ctx);
    }
}